

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

void xmlRelaxNGSetParserErrors
               (xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGValidityErrorFunc err,
               xmlRelaxNGValidityWarningFunc warn,void *ctx)

{
  if (ctxt != (xmlRelaxNGParserCtxtPtr)0x0) {
    ctxt->error = err;
    ctxt->warning = warn;
    ctxt->serror = (xmlStructuredErrorFunc)0x0;
    ctxt->userData = ctx;
  }
  return;
}

Assistant:

void
xmlRelaxNGSetParserErrors(xmlRelaxNGParserCtxtPtr ctxt,
                          xmlRelaxNGValidityErrorFunc err,
                          xmlRelaxNGValidityWarningFunc warn, void *ctx)
{
    if (ctxt == NULL)
        return;
    ctxt->error = err;
    ctxt->warning = warn;
    ctxt->serror = NULL;
    ctxt->userData = ctx;
}